

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O0

bool glcts::verifyResultImage<unsigned_char,4u,3u,3u>
               (GLuint n_mipmap_levels,GLuint n_layers,
               _func_void_GLuint_GLint_GLint_GLint_GLint_uchar_ptr *getComponents,GLubyte *data)

{
  value_type vVar1;
  pointer data_00;
  bool bVar2;
  reference pvVar3;
  uint local_8c;
  GLuint component_offset;
  GLuint component;
  uchar components [4];
  GLuint pixel_offset;
  GLuint pixel;
  GLuint face_offset;
  GLuint face;
  GLuint layer_offset;
  GLuint layer;
  undefined1 local_60 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> expected_values;
  uchar *result_image;
  GLuint n_total_components;
  GLuint n_total_faces;
  GLuint n_faces;
  GLuint n_components_per_face;
  GLuint n_pixels_per_face;
  GLuint face_height;
  GLuint face_width;
  GLuint n_components;
  GLubyte *data_local;
  _func_void_GLuint_GLint_GLint_GLint_GLint_uchar_ptr *getComponents_local;
  GLuint n_layers_local;
  GLuint n_mipmap_levels_local;
  
  expected_values.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = data;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60,
             (ulong)(n_layers * 0xd8));
  for (face = 0;
      data_00 = expected_values.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage, face < n_layers; face = face + 1)
  {
    for (pixel = 0; pixel < 6; pixel = pixel + 1) {
      components[0] = '\0';
      components[1] = '\0';
      components[2] = '\0';
      components[3] = '\0';
      for (; (uint)components < 9; components = (uchar  [4])((int)components + 1)) {
        component = pixel * 0x24 + face * 0xd8 + (int)components * 4;
        (*getComponents)((GLuint)components,pixel,face,n_layers,n_mipmap_levels,
                         (uchar *)&component_offset);
        for (local_8c = 0; local_8c < 4; local_8c = local_8c + 1) {
          vVar1 = *(value_type *)((long)&component_offset + (ulong)local_8c);
          pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60,
                              (ulong)(component + local_8c));
          *pvVar3 = vVar1;
        }
      }
    }
  }
  pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60,0);
  bVar2 = verifyImage<unsigned_char,4u,3u,3u>(data_00,pvVar3,n_layers);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60);
  return bVar2;
}

Assistant:

bool verifyResultImage(glw::GLuint n_mipmap_levels, glw::GLuint n_layers,
					   void (*getComponents)(glw::GLuint pixel_index, glw::GLint cube_face, glw::GLint layer_index,
											 glw::GLint n_layers, glw::GLint n_mipmap_levels, T* out_components),
					   const glw::GLubyte* data)
{
	const glw::GLuint n_components			= N_Components;
	const glw::GLuint face_width			= Width;
	const glw::GLuint face_height			= Height;
	const glw::GLuint n_pixels_per_face		= face_width * face_height;
	const glw::GLuint n_components_per_face = n_pixels_per_face * n_components;
	const glw::GLuint n_faces				= 6;
	const glw::GLuint n_total_faces			= n_layers * n_faces;
	const glw::GLuint n_total_components	= n_total_faces * n_components_per_face;
	const T*		  result_image			= (const T*)data;

	std::vector<T> expected_values;
	expected_values.resize(n_total_components);

	for (glw::GLuint layer = 0; layer < n_layers; ++layer)
	{
		const glw::GLuint layer_offset = layer * n_faces * n_components_per_face;

		for (glw::GLuint face = 0; face < n_faces; ++face)
		{
			const glw::GLuint face_offset = face * n_components_per_face + layer_offset;

			for (glw::GLuint pixel = 0; pixel < n_pixels_per_face; ++pixel)
			{
				const glw::GLuint pixel_offset = pixel * n_components + face_offset;

				T components[n_components];

				getComponents(pixel, face, layer, n_layers, n_mipmap_levels, components);

				for (glw::GLuint component = 0; component < n_components; ++component)
				{
					const glw::GLuint component_offset = pixel_offset + component;

					expected_values[component_offset] = components[component];
				}
			}
		}
	}

	return verifyImage<T, N_Components, Width, Height>(result_image, &expected_values[0], n_layers);
}